

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O1

bool __thiscall ValueType::IsMixedTypedArrayPair(ValueType *this,ValueType other)

{
  bool bVar1;
  ObjectType OVar2;
  ObjectType OVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a [4];
  ValueType other_local;
  
  if ((byte)((byte)(((ushort)other.field_0 & 0x10) >> 4) & *(byte *)&this->field_0 >> 4) == 1) {
    local_2a[0] = other.field_0;
    OVar2 = GetObjectType(this);
    OVar2 = MixedTypedArrayPair[OVar2];
    OVar3 = GetObjectType((ValueType *)&local_2a[0].field_0);
    if (OVar2 == OVar3) {
      return true;
    }
    OVar2 = GetObjectType((ValueType *)&local_2a[0].field_0);
    OVar2 = MixedTypedArrayPair[OVar2];
    OVar3 = GetObjectType(this);
    if (OVar2 == OVar3) {
      return true;
    }
    bVar1 = IsLikelyMixedTypedArrayType(this);
    if (bVar1) {
      bVar1 = IsLikelyMixedTypedArrayType((ValueType *)&local_2a[0].field_0);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ValueType::IsMixedTypedArrayPair(const ValueType other) const
{
    return ( IsLikelyObject() && other.IsLikelyObject() &&
             (    (MixedTypedArrayPair[(int)GetObjectType()] == other.GetObjectType()) ||
                  (MixedTypedArrayPair[(int)other.GetObjectType()] == GetObjectType()) ||
                  (IsLikelyMixedTypedArrayType() && other.IsLikelyMixedTypedArrayType())
             )
           );
}